

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O1

InterpolationViewer * FindPastViewer(AActor *actor)

{
  InterpolationViewer *pIVar1;
  uint uVar2;
  InterpolationViewer *in_RAX;
  InterpolationViewer *pIVar3;
  uint uVar4;
  bool bVar5;
  InterpolationViewer iview;
  InterpolationViewer local_88;
  
  bVar5 = PastViewers.Count != 0;
  if ((bVar5) && (in_RAX = PastViewers.Array, (PastViewers.Array)->ViewActor != actor)) {
    pIVar3 = PastViewers.Array;
    uVar2 = 1;
    do {
      uVar4 = uVar2;
      in_RAX = pIVar3;
      if (PastViewers.Count == uVar4) break;
      in_RAX = pIVar3 + 1;
      pIVar1 = pIVar3 + 1;
      pIVar3 = in_RAX;
      uVar2 = uVar4 + 1;
    } while (pIVar1->ViewActor != actor);
    bVar5 = uVar4 < PastViewers.Count;
  }
  if (!bVar5) {
    local_88.New.Angles.Roll.Degrees = 0.0;
    local_88.New.Angles.CamRoll.Degrees = 0.0;
    local_88.New.Angles.Pitch.Degrees = 0.0;
    local_88.New.Angles.Yaw.Degrees = 0.0;
    local_88.New.Pos.Y = 0.0;
    local_88.New.Pos.Z = 0.0;
    local_88.Old.Angles.CamRoll.Degrees = 0.0;
    local_88.New.Pos.X = 0.0;
    local_88.Old.Angles.Yaw.Degrees = 0.0;
    local_88.Old.Angles.Roll.Degrees = 0.0;
    local_88.Old.Pos.Z = 0.0;
    local_88.Old.Angles.Pitch.Degrees = 0.0;
    local_88.Old.Pos.X = 0.0;
    local_88.Old.Pos.Y = 0.0;
    local_88.otic = -1;
    local_88._12_4_ = 0;
    if (InterpolationPath.Count != 0) {
      InterpolationPath.Count = 0;
    }
    local_88.ViewActor = actor;
    uVar2 = TArray<InterpolationViewer,_InterpolationViewer>::Push(&PastViewers,&local_88);
    in_RAX = PastViewers.Array + uVar2;
  }
  return in_RAX;
}

Assistant:

static InterpolationViewer *FindPastViewer (AActor *actor)
{
	for (unsigned int i = 0; i < PastViewers.Size(); ++i)
	{
		if (PastViewers[i].ViewActor == actor)
		{
			return &PastViewers[i];
		}
	}

	// Not found, so make a new one
	InterpolationViewer iview;
	memset(&iview, 0, sizeof(iview));
	iview.ViewActor = actor;
	iview.otic = -1;
	InterpolationPath.Clear();
	return &PastViewers[PastViewers.Push (iview)];
}